

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O1

qpXmlWriter *
qpXmlWriter_createFileWriter(FILE *outputFile,deBool useCompression,deBool flushAfterWrite)

{
  qpXmlWriter *pqVar1;
  
  pqVar1 = (qpXmlWriter *)deCalloc(0x18);
  if (pqVar1 == (qpXmlWriter *)0x0) {
    pqVar1 = (qpXmlWriter *)0x0;
  }
  else {
    pqVar1->outputFile = outputFile;
    pqVar1->flushAfterWrite = flushAfterWrite;
  }
  return pqVar1;
}

Assistant:

qpXmlWriter* qpXmlWriter_createFileWriter (FILE* outputFile, deBool useCompression, deBool flushAfterWrite)
{
	qpXmlWriter* writer = (qpXmlWriter*)deCalloc(sizeof(qpXmlWriter));
	if (!writer)
		return DE_NULL;

	DE_UNREF(useCompression); /* no compression supported. */

	writer->outputFile = outputFile;
	writer->flushAfterWrite = flushAfterWrite;

	return writer;
}